

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall
Inject::ctor_inject::ctor_inject(ctor_inject *this,type *service1,type *service2,type *service3)

{
  int iVar1;
  type psVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  char *local_d8;
  unique_id local_d0;
  type *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  this->ctor_num = 3;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = service3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,599);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_0015fea8;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_98 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(service1);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_f8 = CONCAT44(extraout_var,iVar1);
  local_d0 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_f0,&local_a0,599,1,2,&local_f8,"service1->id()",&local_d0,"id_of<impl1>::id()");
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,600);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_0015fea8;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_a8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(service2);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_f8 = CONCAT44(extraout_var_00,iVar1);
  local_d0 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_f0,&local_b0,600,1,2,&local_f8,"service2->id()",&local_d0,"id_of<impl1>::id()");
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x259);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_0015fea8;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_b8 = "";
  psVar2 = boost::shared_ptr<Inject::service>::operator->(local_c8);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_f8 = CONCAT44(extraout_var_01,iVar1);
  local_d0 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_f0,&local_c0,0x259,1,2,&local_f8,"service3->id()",&local_d0,"id_of<impl1>::id()"
            );
  return;
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1,
            context<>::ptr<service>::type service2,
            context<>::ptr<service>::type service3) {
        ctor_num = 3;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service2->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service3->id(), id_of<impl1>::id());
    }